

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

void Curl_pgrsSetDownloadSize(SessionHandle *data,curl_off_t size)

{
  uint uVar1;
  
  if (size < 0) {
    (data->progress).size_dl = 0;
    uVar1 = (data->progress).flags & 0xffffffbf;
  }
  else {
    (data->progress).size_dl = size;
    uVar1 = (data->progress).flags | 0x40;
  }
  (data->progress).flags = uVar1;
  return;
}

Assistant:

void Curl_pgrsSetDownloadSize(struct SessionHandle *data, curl_off_t size)
{
  if(size >= 0) {
    data->progress.size_dl = size;
    data->progress.flags |= PGRS_DL_SIZE_KNOWN;
  }
  else {
    data->progress.size_dl = 0;
    data->progress.flags &= ~PGRS_DL_SIZE_KNOWN;
  }
}